

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlDocContentDumpOutput(xmlSaveCtxtPtr ctxt,xmlDocPtr cur)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlCharEncodingOutputFunc p_Var3;
  xmlCharEncodingOutputFunc p_Var4;
  xmlOutputBufferPtr out;
  bool bVar5;
  int iVar6;
  xmlCharEncoding xVar7;
  xmlDtdPtr pxVar8;
  xmlNodePtr local_70;
  xmlNodePtr child;
  int switched_encoding;
  xmlCharEncoding enc;
  xmlOutputBufferPtr buf;
  xmlCharEncodingOutputFunc oldescapeAttr;
  xmlCharEncodingOutputFunc oldescape;
  xmlChar *encoding;
  xmlChar *oldctxtenc;
  xmlChar *oldenc;
  int is_xhtml;
  xmlDtdPtr dtd;
  xmlDocPtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  pxVar1 = cur->encoding;
  pxVar2 = ctxt->encoding;
  oldescape = (xmlCharEncodingOutputFunc)ctxt->encoding;
  p_Var3 = ctxt->escape;
  p_Var4 = ctxt->escapeAttr;
  out = ctxt->buf;
  bVar5 = false;
  xmlInitParser();
  if ((cur->type == XML_HTML_DOCUMENT_NODE) || (cur->type == XML_DOCUMENT_NODE)) {
    if (ctxt->encoding == (xmlChar *)0x0) {
      if (cur->encoding != (xmlChar *)0x0) {
        oldescape = (xmlCharEncodingOutputFunc)cur->encoding;
      }
    }
    else {
      cur->encoding = ctxt->encoding;
    }
    if ((((cur->type == XML_HTML_DOCUMENT_NODE) && ((ctxt->options & 0x20U) == 0)) &&
        ((ctxt->options & 0x10U) == 0)) || ((ctxt->options & 0x40U) != 0)) {
      if (oldescape == (xmlCharEncodingOutputFunc)0x0) {
        oldescape = (xmlCharEncodingOutputFunc)htmlGetMetaEncoding(cur);
      }
      else {
        htmlSetMetaEncoding(cur,(xmlChar *)oldescape);
      }
      if (oldescape == (xmlCharEncodingOutputFunc)0x0) {
        oldescape = (xmlCharEncodingOutputFunc)anon_var_dwarf_d59c;
      }
      if (((oldescape == (xmlCharEncodingOutputFunc)0x0) || (pxVar2 != (xmlChar *)0x0)) ||
         ((out->encoder != (xmlCharEncodingHandlerPtr)0x0 ||
          ((out->conv != (xmlBufPtr)0x0 ||
           (iVar6 = xmlSaveSwitchEncoding(ctxt,(char *)oldescape), -1 < iVar6)))))) {
        if ((ctxt->options & 1U) == 0) {
          htmlDocContentDumpFormatOutput(out,cur,(char *)oldescape,0);
        }
        else {
          htmlDocContentDumpFormatOutput(out,cur,(char *)oldescape,1);
        }
        if (ctxt->encoding != (xmlChar *)0x0) {
          cur->encoding = pxVar1;
        }
        ctxt_local._4_4_ = 0;
      }
      else {
        cur->encoding = pxVar1;
        ctxt_local._4_4_ = -1;
      }
    }
    else {
      if (((cur->type == XML_DOCUMENT_NODE) || ((ctxt->options & 0x20U) != 0)) ||
         ((ctxt->options & 0x10U) != 0)) {
        xVar7 = xmlParseCharEncoding((char *)oldescape);
        if (((oldescape != (xmlCharEncodingOutputFunc)0x0) && (pxVar2 == (xmlChar *)0x0)) &&
           ((out->encoder == (xmlCharEncodingHandlerPtr)0x0 &&
            ((out->conv == (xmlBufPtr)0x0 && ((ctxt->options & 2U) == 0)))))) {
          if ((xVar7 != XML_CHAR_ENCODING_UTF8) &&
             ((xVar7 != XML_CHAR_ENCODING_NONE && (xVar7 != XML_CHAR_ENCODING_ASCII)))) {
            iVar6 = xmlSaveSwitchEncoding(ctxt,(char *)oldescape);
            if (iVar6 < 0) {
              cur->encoding = pxVar1;
              return -1;
            }
            bVar5 = true;
          }
          if (ctxt->escape == xmlEscapeEntities) {
            ctxt->escape = (xmlCharEncodingOutputFunc)0x0;
          }
          if (ctxt->escapeAttr == xmlEscapeEntities) {
            ctxt->escapeAttr = (xmlCharEncodingOutputFunc)0x0;
          }
        }
        if ((ctxt->options & 2U) == 0) {
          xmlOutputBufferWrite(out,0xe,"<?xml version=");
          if (cur->version == (xmlChar *)0x0) {
            xmlOutputBufferWrite(out,5,"\"1.0\"");
          }
          else {
            xmlBufWriteQuotedString(out->buffer,cur->version);
          }
          if (oldescape != (xmlCharEncodingOutputFunc)0x0) {
            xmlOutputBufferWrite(out,10," encoding=");
            xmlBufWriteQuotedString(out->buffer,(xmlChar *)oldescape);
          }
          if (cur->standalone == 0) {
            xmlOutputBufferWrite(out,0x10," standalone=\"no\"");
          }
          else if (cur->standalone == 1) {
            xmlOutputBufferWrite(out,0x11," standalone=\"yes\"");
          }
          xmlOutputBufferWrite(out,3,"?>\n");
        }
        oldenc._4_4_ = (uint)((ctxt->options & 0x10U) != 0);
        if ((((ctxt->options & 8U) == 0) &&
            (pxVar8 = xmlGetIntSubset(cur), pxVar8 != (xmlDtdPtr)0x0)) &&
           (oldenc._4_4_ = xmlIsXHTML(pxVar8->SystemID,pxVar8->ExternalID), (int)oldenc._4_4_ < 0))
        {
          oldenc._4_4_ = 0;
        }
        if (cur->children != (_xmlNode *)0x0) {
          for (local_70 = cur->children; local_70 != (xmlNodePtr)0x0; local_70 = local_70->next) {
            ctxt->level = 0;
            if (oldenc._4_4_ == 0) {
              xmlNodeDumpOutputInternal(ctxt,local_70);
            }
            else {
              xhtmlNodeDumpOutput(ctxt,local_70);
            }
            if ((local_70->type != XML_XINCLUDE_START) && (local_70->type != XML_XINCLUDE_END)) {
              xmlOutputBufferWrite(out,1,"\n");
            }
          }
        }
      }
      if ((bVar5) && (pxVar2 == (xmlChar *)0x0)) {
        xmlSaveClearEncoding(ctxt);
        ctxt->escape = p_Var3;
        ctxt->escapeAttr = p_Var4;
      }
      cur->encoding = pxVar1;
      ctxt_local._4_4_ = 0;
    }
  }
  else {
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlDocContentDumpOutput(xmlSaveCtxtPtr ctxt, xmlDocPtr cur) {
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif
    const xmlChar *oldenc = cur->encoding;
    const xmlChar *oldctxtenc = ctxt->encoding;
    const xmlChar *encoding = ctxt->encoding;
    xmlCharEncodingOutputFunc oldescape = ctxt->escape;
    xmlCharEncodingOutputFunc oldescapeAttr = ctxt->escapeAttr;
    xmlOutputBufferPtr buf = ctxt->buf;
    xmlCharEncoding enc;
    int switched_encoding = 0;

    xmlInitParser();

    if ((cur->type != XML_HTML_DOCUMENT_NODE) &&
        (cur->type != XML_DOCUMENT_NODE))
	 return(-1);

    if (ctxt->encoding != NULL) {
        cur->encoding = BAD_CAST ctxt->encoding;
    } else if (cur->encoding != NULL) {
	encoding = cur->encoding;
    }

    if (((cur->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0) &&
         ((ctxt->options & XML_SAVE_XHTML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
#ifdef LIBXML_HTML_ENABLED
        if (encoding != NULL)
	    htmlSetMetaEncoding(cur, (const xmlChar *) encoding);
        if (encoding == NULL)
	    encoding = htmlGetMetaEncoding(cur);
        if (encoding == NULL)
	    encoding = BAD_CAST "HTML";
	if ((encoding != NULL) && (oldctxtenc == NULL) &&
	    (buf->encoder == NULL) && (buf->conv == NULL)) {
	    if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		cur->encoding = oldenc;
		return(-1);
	    }
	}
        if (ctxt->options & XML_SAVE_FORMAT)
	    htmlDocContentDumpFormatOutput(buf, cur,
	                                   (const char *)encoding, 1);
	else
	    htmlDocContentDumpFormatOutput(buf, cur,
	                                   (const char *)encoding, 0);
	if (ctxt->encoding != NULL)
	    cur->encoding = oldenc;
	return(0);
#else
        return(-1);
#endif
    } else if ((cur->type == XML_DOCUMENT_NODE) ||
               (ctxt->options & XML_SAVE_AS_XML) ||
               (ctxt->options & XML_SAVE_XHTML)) {
	enc = xmlParseCharEncoding((const char*) encoding);
	if ((encoding != NULL) && (oldctxtenc == NULL) &&
	    (buf->encoder == NULL) && (buf->conv == NULL) &&
	    ((ctxt->options & XML_SAVE_NO_DECL) == 0)) {
	    if ((enc != XML_CHAR_ENCODING_UTF8) &&
		(enc != XML_CHAR_ENCODING_NONE) &&
		(enc != XML_CHAR_ENCODING_ASCII)) {
		/*
		 * we need to switch to this encoding but just for this
		 * document since we output the XMLDecl the conversion
		 * must be done to not generate not well formed documents.
		 */
		if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		    cur->encoding = oldenc;
		    return(-1);
		}
		switched_encoding = 1;
	    }
	    if (ctxt->escape == xmlEscapeEntities)
		ctxt->escape = NULL;
	    if (ctxt->escapeAttr == xmlEscapeEntities)
		ctxt->escapeAttr = NULL;
	}


	/*
	 * Save the XML declaration
	 */
	if ((ctxt->options & XML_SAVE_NO_DECL) == 0) {
	    xmlOutputBufferWrite(buf, 14, "<?xml version=");
	    if (cur->version != NULL)
		xmlBufWriteQuotedString(buf->buffer, cur->version);
	    else
		xmlOutputBufferWrite(buf, 5, "\"1.0\"");
	    if (encoding != NULL) {
		xmlOutputBufferWrite(buf, 10, " encoding=");
		xmlBufWriteQuotedString(buf->buffer, (xmlChar *) encoding);
	    }
	    switch (cur->standalone) {
		case 0:
		    xmlOutputBufferWrite(buf, 16, " standalone=\"no\"");
		    break;
		case 1:
		    xmlOutputBufferWrite(buf, 17, " standalone=\"yes\"");
		    break;
	    }
	    xmlOutputBufferWrite(buf, 3, "?>\n");
	}

#ifdef LIBXML_HTML_ENABLED
        if (ctxt->options & XML_SAVE_XHTML)
            is_xhtml = 1;
	if ((ctxt->options & XML_SAVE_NO_XHTML) == 0) {
	    dtd = xmlGetIntSubset(cur);
	    if (dtd != NULL) {
		is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
		if (is_xhtml < 0) is_xhtml = 0;
	    }
	}
#endif
	if (cur->children != NULL) {
	    xmlNodePtr child = cur->children;

	    while (child != NULL) {
		ctxt->level = 0;
#ifdef LIBXML_HTML_ENABLED
		if (is_xhtml)
		    xhtmlNodeDumpOutput(ctxt, child);
		else
#endif
		    xmlNodeDumpOutputInternal(ctxt, child);
                if ((child->type != XML_XINCLUDE_START) &&
                    (child->type != XML_XINCLUDE_END))
                    xmlOutputBufferWrite(buf, 1, "\n");
		child = child->next;
	    }
	}
    }

    /*
     * Restore the state of the saving context at the end of the document
     */
    if ((switched_encoding) && (oldctxtenc == NULL)) {
	xmlSaveClearEncoding(ctxt);
	ctxt->escape = oldescape;
	ctxt->escapeAttr = oldescapeAttr;
    }
    cur->encoding = oldenc;
    return(0);
}